

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InReadableOrder.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_116d1be::ReadableOrderTraverser::visit
          (ReadableOrderTraverser *this,Block *block,ReachReason why,Block *header)

{
  unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
  *this_00;
  unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
  *this_01;
  pointer puVar1;
  Instruction *pIVar2;
  Block *pBVar3;
  const_iterator cVar4;
  __hashtable *__h_1;
  pointer ppBVar5;
  __hashtable *__h_2;
  Block *continueBlock;
  Block *mergeBlock;
  __node_gen_type __node_gen;
  Block *local_50;
  key_type local_48;
  key_type local_40;
  unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
  *local_38;
  
  local_50 = block;
  if (block == (Block *)0x0) {
    __assert_fail("block",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/InReadableOrder.cpp"
                  ,0x49,
                  "void (anonymous namespace)::ReadableOrderTraverser::visit(Block *, spv::ReachReason, Block *)"
                 );
  }
  if (why == ReachViaControlFlow) {
    local_38 = &this->reachableViaControlFlow_;
    std::
    _Hashtable<spv::Block*,spv::Block*,std::allocator<spv::Block*>,std::__detail::_Identity,std::equal_to<spv::Block*>,std::hash<spv::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<spv::Block*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spv::Block*,false>>>>
              ((_Hashtable<spv::Block*,spv::Block*,std::allocator<spv::Block*>,std::__detail::_Identity,std::equal_to<spv::Block*>,std::hash<spv::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_38,&local_50);
  }
  this_00 = &this->visited_;
  cVar4 = std::
          _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,&local_50);
  if (cVar4.super__Node_iterator_base<spv::Block_*,_false>._M_cur == (__node_type *)0x0) {
    this_01 = &this->delayed_;
    cVar4 = std::
            _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this_01->_M_h,&local_50);
    if (cVar4.super__Node_iterator_base<spv::Block_*,_false>._M_cur == (__node_type *)0x0) {
      std::function<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*)>::operator()
                (&this->callback_,local_50,why,header);
      local_38 = this_00;
      std::
      _Hashtable<spv::Block*,spv::Block*,std::allocator<spv::Block*>,std::__detail::_Identity,std::equal_to<spv::Block*>,std::hash<spv::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spv::Block*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spv::Block*,false>>>>
                ((_Hashtable<spv::Block*,spv::Block*,std::allocator<spv::Block*>,std::__detail::_Identity,std::equal_to<spv::Block*>,std::hash<spv::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_00,&local_50);
      local_40 = (Block *)0x0;
      local_48 = (Block *)0x0;
      puVar1 = (local_50->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((8 < (ulong)((long)puVar1 -
                      (long)(local_50->instructions).
                            super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) &&
         (pIVar2 = puVar1[-2]._M_t.
                   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,
         (pIVar2->opCode & ~OpUndef) == OpLoopMerge)) {
        if ((**(byte **)&(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl & 1)
            == 0) {
LAB_0044986b:
          __assert_fail("idOperand[op]",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                        ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
        }
        local_40 = (local_50->parent->parent->idToInstruction).
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [**(uint **)&(pIVar2->operands).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl]->block;
        local_38 = this_01;
        std::
        _Hashtable<spv::Block*,spv::Block*,std::allocator<spv::Block*>,std::__detail::_Identity,std::equal_to<spv::Block*>,std::hash<spv::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spv::Block*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spv::Block*,false>>>>
                  ((_Hashtable<spv::Block*,spv::Block*,std::allocator<spv::Block*>,std::__detail::_Identity,std::equal_to<spv::Block*>,std::hash<spv::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this_01);
        if (pIVar2->opCode == OpLoopMerge) {
          if ((**(byte **)&(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl &
              2) == 0) goto LAB_0044986b;
          local_48 = (local_50->parent->parent->idToInstruction).
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [*(uint *)(*(long *)&(pIVar2->operands).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl + 4)]->block;
          local_38 = this_01;
          std::
          _Hashtable<spv::Block*,spv::Block*,std::allocator<spv::Block*>,std::__detail::_Identity,std::equal_to<spv::Block*>,std::hash<spv::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<spv::Block*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spv::Block*,false>>>>
                    ((_Hashtable<spv::Block*,spv::Block*,std::allocator<spv::Block*>,std::__detail::_Identity,std::equal_to<spv::Block*>,std::hash<spv::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)this_01);
        }
      }
      pBVar3 = local_50;
      if (why == ReachViaControlFlow) {
        for (ppBVar5 = (local_50->successors).
                       super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            ppBVar5 !=
            (pBVar3->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; ppBVar5 = ppBVar5 + 1) {
          visit(this,*ppBVar5,ReachViaControlFlow,(Block *)0x0);
        }
      }
      if (local_48 != (Block *)0x0) {
        cVar4 = std::
                _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(this->reachableViaControlFlow_)._M_h,&local_48);
        std::
        _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_erase(&this_01->_M_h,&local_48);
        visit(this,local_48,
              (uint)(cVar4.super__Node_iterator_base<spv::Block_*,_false>._M_cur ==
                    (__node_type *)0x0),local_50);
      }
      if (local_40 != (Block *)0x0) {
        cVar4 = std::
                _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(this->reachableViaControlFlow_)._M_h,&local_40);
        std::
        _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_erase(&this_01->_M_h,&local_40);
        visit(this,local_40,
              (uint)(cVar4.super__Node_iterator_base<spv::Block_*,_false>._M_cur ==
                    (__node_type *)0x0) * 2,local_50);
      }
    }
  }
  return;
}

Assistant:

void visit(Block* block, spv::ReachReason why, Block* header)
    {
        assert(block);
        if (why == spv::ReachViaControlFlow) {
            reachableViaControlFlow_.insert(block);
        }
        if (visited_.count(block) || delayed_.count(block))
            return;
        callback_(block, why, header);
        visited_.insert(block);
        Block* mergeBlock = nullptr;
        Block* continueBlock = nullptr;
        auto mergeInst = block->getMergeInstruction();
        if (mergeInst) {
            Id mergeId = mergeInst->getIdOperand(0);
            mergeBlock = block->getParent().getParent().getInstruction(mergeId)->getBlock();
            delayed_.insert(mergeBlock);
            if (mergeInst->getOpCode() == spv::OpLoopMerge) {
                Id continueId = mergeInst->getIdOperand(1);
                continueBlock =
                    block->getParent().getParent().getInstruction(continueId)->getBlock();
                delayed_.insert(continueBlock);
            }
        }
        if (why == spv::ReachViaControlFlow) {
            const auto& successors = block->getSuccessors();
            for (auto it = successors.cbegin(); it != successors.cend(); ++it)
                visit(*it, why, nullptr);
        }
        if (continueBlock) {
            const spv::ReachReason continueWhy =
                (reachableViaControlFlow_.count(continueBlock) > 0)
                    ? spv::ReachViaControlFlow
                    : spv::ReachDeadContinue;
            delayed_.erase(continueBlock);
            visit(continueBlock, continueWhy, block);
        }
        if (mergeBlock) {
            const spv::ReachReason mergeWhy =
                (reachableViaControlFlow_.count(mergeBlock) > 0)
                    ? spv::ReachViaControlFlow
                    : spv::ReachDeadMerge;
            delayed_.erase(mergeBlock);
            visit(mergeBlock, mergeWhy, block);
        }
    }